

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O1

Float<unsigned_int,_8,_23,_127,_3U>
tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
          (Float<unsigned_short,_5,_10,_15,_3U> *other)

{
  ushort uVar1;
  long lVar2;
  StorageType SVar3;
  uint uVar4;
  int iVar5;
  ushort uVar6;
  bool bVar7;
  bool bVar8;
  
  uVar1 = other->m_value;
  if ((uVar1 & 0x7fff) == 0x7c00) {
    SVar3 = (uint)(-1 < (short)uVar1) * -0x80000000 - 0x800000;
  }
  else {
    uVar6 = uVar1 & 0x3ff;
    SVar3 = 0x7fffffff;
    if ((uVar1 & 0x7c00) != 0x7c00 || uVar6 == 0) {
      if ((uVar1 & 0x7fff) != 0) {
        bVar7 = uVar6 != 0;
        bVar8 = (uVar1 & 0x7c00) == 0;
        iVar5 = -0xe;
        if (!bVar8 || !bVar7) {
          iVar5 = (uVar1 >> 10 & 0x1f) - 0xf;
        }
        if (!bVar8 || !bVar7) {
          uVar6 = uVar6 + 0x400;
        }
        uVar4 = (uint)uVar6;
        if (bVar8 && bVar7) {
          lVar2 = 0x3f;
          if ((uVar6 & 0x3ff) != 0) {
            for (; (uVar6 & 0x3ff) >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          uVar4 = (uint)uVar6 << (~(byte)lVar2 + 0xb & 0x3f);
          iVar5 = (iVar5 - ((uint)lVar2 ^ 0x3f)) + 0x35;
        }
        return (Float<unsigned_int,_8,_23,_127,_3U>)
               ((uVar4 & 0x7fbff) << 0xd | iVar5 * 0x800000 + 0x3f800000U | (uVar1 & 0x8000) << 0x10
               );
      }
      return (Float<unsigned_int,_8,_23,_127,_3U>)((uint)uVar1 << 0x10);
    }
  }
  return (Float<unsigned_int,_8,_23,_127,_3U>)SVar3;
}

Assistant:

inline int				sign			(void) const	{ return signBit() ? -1 : 1;																			}